

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_do_toggle(nk_flags *state,nk_command_buffer *out,nk_rect r,nk_bool *active,char *str,
                    int len,nk_toggle_type type,nk_style_toggle *style,nk_input *in,
                    nk_user_font *font)

{
  nk_rect select_00;
  nk_bool nVar1;
  int in_ECX;
  nk_user_font *in_RDX;
  long in_RSI;
  uint in_R8D;
  int in_R9D;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float active_00;
  float fVar6;
  float fVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  long in_stack_00000008;
  long in_stack_00000018;
  nk_rect label;
  nk_rect cursor;
  nk_rect select;
  nk_rect bounds;
  int was_active;
  nk_flags *in_stack_ffffffffffffff48;
  nk_input *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  float local_98;
  float local_94;
  float local_90;
  float fVar8;
  float fVar9;
  int iVar10;
  float local_1c;
  float fStack_18;
  float local_14;
  float fStack_10;
  uint local_c;
  
  if ((((in_RSI == 0) || (in_stack_00000008 == 0)) || (in_stack_00000018 == 0)) ||
     (in_RDX == (nk_user_font *)0x0)) {
    local_c = 0;
  }
  else {
    local_14 = (float)in_XMM1_Qa;
    if (*(float *)(in_stack_00000008 + 0xbc) + *(float *)(in_stack_00000008 + 0xbc) +
        *(float *)(in_stack_00000018 + 8) <= local_14) {
      local_90 = local_14;
    }
    else {
      local_90 = *(float *)(in_stack_00000008 + 0xbc) + *(float *)(in_stack_00000008 + 0xbc) +
                 *(float *)(in_stack_00000018 + 8);
    }
    fStack_10 = (float)((ulong)in_XMM1_Qa >> 0x20);
    if (*(float *)(in_stack_00000008 + 0xc0) + *(float *)(in_stack_00000008 + 0xc0) +
        *(float *)(in_stack_00000018 + 8) <= fStack_10) {
      local_94 = fStack_10;
    }
    else {
      local_94 = *(float *)(in_stack_00000008 + 0xc0) + *(float *)(in_stack_00000008 + 0xc0) +
                 *(float *)(in_stack_00000018 + 8);
    }
    local_1c = (float)in_XMM0_Qa;
    fVar2 = local_1c - *(float *)(in_stack_00000008 + 0xc4);
    fStack_18 = (float)((ulong)in_XMM0_Qa >> 0x20);
    fVar3 = *(float *)(in_stack_00000008 + 200) + *(float *)(in_stack_00000008 + 200) + local_94;
    fVar8 = *(float *)(in_stack_00000018 + 8);
    fVar4 = (fStack_18 + local_94 / 2.0) - fVar8 / 2.0;
    fVar5 = local_1c + *(float *)(in_stack_00000008 + 0xbc) + *(float *)(in_stack_00000008 + 0xd0);
    active_00 = fVar8 - (*(float *)(in_stack_00000008 + 0xbc) + *(float *)(in_stack_00000008 + 0xbc)
                        + *(float *)(in_stack_00000008 + 0xd0) * 2.0);
    fVar6 = fVar8 - (*(float *)(in_stack_00000008 + 0xc0) + *(float *)(in_stack_00000008 + 0xc0) +
                    *(float *)(in_stack_00000008 + 0xd0) * 2.0);
    fVar7 = local_1c + fVar8 + *(float *)(in_stack_00000008 + 0xcc);
    local_98 = fVar7;
    if (fVar7 <= local_1c + local_90) {
      local_98 = local_1c + local_90;
    }
    local_98 = local_98 - fVar7;
    iVar10 = (in_RDX->userdata).id;
    select_00.y = (float)in_stack_ffffffffffffff5c;
    select_00.x = (float)in_stack_ffffffffffffff58;
    select_00._8_8_ = in_stack_ffffffffffffff60;
    fVar7 = fVar8;
    fVar9 = fVar8;
    nVar1 = nk_toggle_behavior(in_stack_ffffffffffffff50,select_00,in_stack_ffffffffffffff48,0);
    (in_RDX->userdata).id = nVar1;
    if (*(long *)(in_stack_00000008 + 0xe0) != 0) {
      (**(code **)(in_stack_00000008 + 0xe0))(in_RSI,*(undefined8 *)(in_stack_00000008 + 0xd8));
    }
    if (in_R9D == 0) {
      nk_draw_checkbox((nk_command_buffer *)CONCAT44(fVar2,fVar9),(nk_flags)fVar7,
                       (nk_style_toggle *)CONCAT44(local_1c,fVar6),(nk_bool)active_00,
                       (nk_rect *)CONCAT44(fVar5,fVar8),(nk_rect *)CONCAT44(local_98,fVar4),
                       (nk_rect *)CONCAT44(iVar10,fVar3),(char *)((ulong)in_R8D << 0x20),in_ECX,
                       in_RDX);
    }
    else {
      nk_draw_option((nk_command_buffer *)CONCAT44(fVar2,fVar9),(nk_flags)fVar7,
                     (nk_style_toggle *)CONCAT44(local_1c,fVar6),(nk_bool)active_00,
                     (nk_rect *)CONCAT44(fVar5,fVar8),(nk_rect *)CONCAT44(local_98,fVar4),
                     (nk_rect *)CONCAT44(iVar10,fVar3),(char *)CONCAT44(in_R8D,in_R9D),in_ECX,in_RDX
                    );
    }
    if (*(long *)(in_stack_00000008 + 0xe8) != 0) {
      (**(code **)(in_stack_00000008 + 0xe8))(in_RSI,*(undefined8 *)(in_stack_00000008 + 0xd8));
    }
    local_c = (uint)(iVar10 != (in_RDX->userdata).id);
  }
  return local_c;
}

Assistant:

NK_LIB nk_bool
nk_do_toggle(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect r,
nk_bool *active, const char *str, int len, enum nk_toggle_type type,
const struct nk_style_toggle *style, const struct nk_input *in,
const struct nk_user_font *font)
{
int was_active;
struct nk_rect bounds;
struct nk_rect select;
struct nk_rect cursor;
struct nk_rect label;

NK_ASSERT(style);
NK_ASSERT(out);
NK_ASSERT(font);
if (!out || !style || !font || !active)
return 0;

r.w = NK_MAX(r.w, font->height + 2 * style->padding.x);
r.h = NK_MAX(r.h, font->height + 2 * style->padding.y);

/* add additional touch padding for touch screen devices */
bounds.x = r.x - style->touch_padding.x;
bounds.y = r.y - style->touch_padding.y;
bounds.w = r.w + 2 * style->touch_padding.x;
bounds.h = r.h + 2 * style->touch_padding.y;

/* calculate the selector space */
select.w = font->height;
select.h = select.w;
select.y = r.y + r.h/2.0f - select.h/2.0f;
select.x = r.x;

/* calculate the bounds of the cursor inside the selector */
cursor.x = select.x + style->padding.x + style->border;
cursor.y = select.y + style->padding.y + style->border;
cursor.w = select.w - (2 * style->padding.x + 2 * style->border);
cursor.h = select.h - (2 * style->padding.y + 2 * style->border);

/* label behind the selector */
label.x = select.x + select.w + style->spacing;
label.y = select.y;
label.w = NK_MAX(r.x + r.w, label.x) - label.x;
label.h = select.w;

/* update selector */
was_active = *active;
*active = nk_toggle_behavior(in, bounds, state, *active);

/* draw selector */
if (style->draw_begin)
style->draw_begin(out, style->userdata);
if (type == NK_TOGGLE_CHECK) {
nk_draw_checkbox(out, *state, style, *active, &label, &select, &cursor, str, len, font);
} else {
nk_draw_option(out, *state, style, *active, &label, &select, &cursor, str, len, font);
}
if (style->draw_end)
style->draw_end(out, style->userdata);
return (was_active != *active);
}